

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall llvm::sys::path::relative_path(path *this,StringRef path,Style style)

{
  StringRef SVar1;
  unsigned_long *puVar2;
  path *ppVar3;
  StringRef SVar4;
  StringRef root;
  path *ppStack_78;
  Style style_local;
  StringRef path_local;
  unsigned_long local_50 [2];
  char *local_40;
  undefined1 *local_38;
  
  path_local.Data = path.Data;
  SVar4.Length = (size_t)path_local.Data;
  SVar4.Data = (char *)this;
  ppStack_78 = this;
  SVar4 = root_path(SVar4,(Style)path.Length);
  root.Data = (char *)SVar4.Length;
  local_40 = root.Data;
  local_38 = (undefined1 *)&stack0xffffffffffffff88;
  local_50[1] = 0xffffffffffffffff;
  puVar2 = std::min<unsigned_long>((unsigned_long *)&local_40,(unsigned_long *)&path_local);
  local_40 = (char *)*puVar2;
  ppVar3 = ppStack_78 + (long)local_40;
  local_50[0] = (long)path_local.Data - (long)local_40;
  puVar2 = std::min<unsigned_long>(local_50 + 1,local_50);
  SVar1.Length = *puVar2;
  SVar1.Data = (char *)ppVar3;
  return SVar1;
}

Assistant:

StringRef relative_path(StringRef path, Style style) {
  StringRef root = root_path(path, style);
  return path.substr(root.size());
}